

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_free(Tree *this)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  bool bVar4;
  size_t sVar5;
  NodeData *pNVar6;
  char *pcVar7;
  char msg [26];
  char local_28 [32];
  
  pNVar6 = this->m_buf;
  if (pNVar6 != (NodeData *)0x0) {
    sVar5 = this->m_cap;
    if (sVar5 == 0) {
      builtin_strncpy(local_28 + 0x10,"_cap > 0)",10);
      builtin_strncpy(local_28,"check failed: (m",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      LVar2.super_LineCol.col = 0;
      LVar2.super_LineCol.offset = SUB168(ZEXT816(0x62c0) << 0x40,0);
      LVar2.super_LineCol.line = SUB168(ZEXT816(0x62c0) << 0x40,8);
      LVar2.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar2.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_28,0x1a,LVar2,(this->m_callbacks).m_user_data);
      pNVar6 = this->m_buf;
      sVar5 = this->m_cap;
    }
    (*(this->m_callbacks).m_free)(pNVar6,sVar5 * 0x90,(this->m_callbacks).m_user_data);
    this->m_buf = (NodeData *)0x0;
  }
  pcVar7 = (this->m_arena).str;
  if (pcVar7 != (char *)0x0) {
    sVar5 = (this->m_arena).len;
    if (sVar5 == 0) {
      builtin_strncpy(local_28 + 0x10,"_arena.len > 0)",0x10);
      builtin_strncpy(local_28,"check failed: (m",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x62c5) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x62c5) << 0x40,8);
      LVar3.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar3.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_28,0x20,LVar3,(this->m_callbacks).m_user_data);
      pcVar7 = (this->m_arena).str;
      sVar5 = (this->m_arena).len;
    }
    (*(this->m_callbacks).m_free)(pcVar7,sVar5,(this->m_callbacks).m_user_data);
  }
  (this->m_arena).len = 0;
  this->m_arena_pos = 0;
  this->m_free_tail = 0;
  (this->m_arena).str = (char *)0x0;
  this->m_size = 0;
  this->m_free_head = 0;
  this->m_buf = (NodeData *)0x0;
  this->m_cap = 0;
  memset(this->m_tag_directives,0,0xa0);
  return;
}

Assistant:

void Tree::_free()
{
    if(m_buf)
    {
        _RYML_CB_ASSERT(m_callbacks, m_cap > 0);
        _RYML_CB_FREE(m_callbacks, m_buf, NodeData, m_cap);
    }
    if(m_arena.str)
    {
        _RYML_CB_ASSERT(m_callbacks, m_arena.len > 0);
        _RYML_CB_FREE(m_callbacks, m_arena.str, char, m_arena.len);
    }
    _clear();
}